

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8SetIntra16Mode(VP8EncIterator *it,int mode)

{
  uint in_ESI;
  long in_RDI;
  int y;
  uint8_t *preds;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = *(void **)(in_RDI + 0x40);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    memset(local_18,in_ESI & 0xff,4);
    local_18 = (void *)((long)local_18 + (long)*(int *)(*(long *)(in_RDI + 0x28) + 0x38));
  }
  **(byte **)(in_RDI + 0x30) = **(byte **)(in_RDI + 0x30) & 0xfc | 1;
  return;
}

Assistant:

void VP8SetIntra16Mode(const VP8EncIterator* const it, int mode) {
  uint8_t* preds = it->preds_;
  int y;
  for (y = 0; y < 4; ++y) {
    memset(preds, mode, 4);
    preds += it->enc_->preds_w_;
  }
  it->mb_->type_ = 1;
}